

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O1

BrotliEncoderStateInternal *
duckdb_brotli::BrotliEncoderCreateInstance
          (brotli_alloc_func alloc_func,brotli_free_func free_func,void *opaque)

{
  undefined8 uVar1;
  BrotliEncoderStateInternal *pBVar2;
  BrotliEncoderStateInternal *pBVar3;
  
  pBVar2 = (BrotliEncoderStateInternal *)BrotliBootstrapAlloc(0x1b40,alloc_func,free_func,opaque);
  pBVar3 = (BrotliEncoderStateInternal *)0x0;
  if (pBVar2 != (BrotliEncoderStateInternal *)0x0) {
    BrotliInitMemoryManager(&pBVar2->memory_manager_,alloc_func,free_func,opaque);
    (pBVar2->params).mode = BROTLI_MODE_GENERIC;
    (pBVar2->params).quality = 0xb;
    (pBVar2->params).large_window = 0;
    (pBVar2->params).lgwin = 0x16;
    *(undefined8 *)&(pBVar2->params).lgblock = 0;
    *(undefined8 *)((long)&(pBVar2->params).stream_offset + 4) = 0;
    *(undefined8 *)((long)&(pBVar2->params).size_hint + 4) = 0;
    BrotliInitSharedEncoderDictionary(&(pBVar2->params).dictionary);
    (pBVar2->params).dist.distance_postfix_bits = 0;
    (pBVar2->params).dist.num_direct_distance_codes = 0;
    (pBVar2->params).dist.alphabet_size_max = 0x40;
    (pBVar2->params).dist.alphabet_size_limit = 0x40;
    (pBVar2->params).dist.max_distance = 0x3fffffc;
    pBVar2->input_pos_ = 0;
    pBVar2->prev_byte_ = '\0';
    pBVar2->prev_byte2_ = '\0';
    pBVar2->stream_state_ = BROTLI_STREAM_PROCESSING;
    pBVar2->is_last_block_emitted_ = 0;
    pBVar2->is_initialized_ = 0;
    (pBVar2->ringbuffer_).cur_size_ = 0;
    (pBVar2->ringbuffer_).pos_ = 0;
    (pBVar2->ringbuffer_).data_ = (uint8_t *)0x0;
    (pBVar2->ringbuffer_).buffer_ = (uint8_t *)0x0;
    pBVar2->cmd_alloc_size_ = 0;
    pBVar2->commands_ = (Command *)0x0;
    pBVar2->num_commands_ = 0;
    pBVar2->num_literals_ = 0;
    pBVar2->last_insert_len_ = 0;
    pBVar2->last_flush_pos_ = 0;
    pBVar2->last_processed_pos_ = 0;
    pBVar2->storage_size_ = 0;
    pBVar2->storage_ = (uint8_t *)0x0;
    (pBVar2->hasher_).common.extra[0] = (void *)0x0;
    (pBVar2->hasher_).common.extra[1] = (void *)0x0;
    (pBVar2->hasher_).common.extra[2] = (void *)0x0;
    (pBVar2->hasher_).common.extra[3] = (void *)0x0;
    (pBVar2->hasher_).common.is_setup_ = 0;
    pBVar2->large_table_ = (int *)0x0;
    pBVar2->large_table_size_ = 0;
    pBVar2->one_pass_arena_ = (BrotliOnePassArena *)0x0;
    pBVar2->two_pass_arena_ = (BrotliTwoPassArena *)0x0;
    pBVar2->command_buf_ = (uint32_t *)0x0;
    pBVar2->literal_buf_ = (uint8_t *)0x0;
    pBVar2->total_in_ = 0;
    pBVar2->next_out_ = (uint8_t *)0x0;
    pBVar2->available_out_ = 0;
    pBVar2->total_out_ = 0;
    pBVar2->dist_cache_[0] = 4;
    pBVar2->dist_cache_[1] = 0xb;
    pBVar2->dist_cache_[2] = 0xf;
    pBVar2->dist_cache_[3] = 0x10;
    uVar1 = *(undefined8 *)(pBVar2->dist_cache_ + 2);
    *(undefined8 *)pBVar2->saved_dist_cache_ = *(undefined8 *)pBVar2->dist_cache_;
    *(undefined8 *)(pBVar2->saved_dist_cache_ + 2) = uVar1;
    pBVar3 = pBVar2;
  }
  return pBVar3;
}

Assistant:

BrotliEncoderState* duckdb_brotli::BrotliEncoderCreateInstance(
    brotli_alloc_func alloc_func, brotli_free_func free_func, void* opaque) {
  BrotliEncoderState* state = (BrotliEncoderState*)BrotliBootstrapAlloc(
      sizeof(BrotliEncoderState), alloc_func, free_func, opaque);
  if (state == NULL) {
    /* BROTLI_DUMP(); */
    return 0;
  }
  BrotliInitMemoryManager(
      &state->memory_manager_, alloc_func, free_func, opaque);
  BrotliEncoderInitState(state);
  return state;
}